

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::internal::PrintCharsAsStringTo(char *begin,size_t len,ostream *os)

{
  size_t index;
  size_t sVar1;
  
  std::operator<<(os,"\"");
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    PrintAsWideStringLiteralTo((uint)(byte)begin[sVar1],os);
  }
  std::operator<<(os,"\"");
  return;
}

Assistant:

static void PrintCharsAsStringTo(const char* begin, size_t len, ostream* os) {
  *os << "\"";
  for (size_t index = 0; index < len; ++index) {
    PrintAsStringLiteralTo(begin[index], os);
  }
  *os << "\"";
}